

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_mul_add_simple(mp_int *r,mp_int *a,mp_int *b)

{
  BignumInt *pBVar1;
  size_t sVar2;
  BignumInt *pBVar3;
  size_t sVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  BignumInt *pBVar8;
  ulong uVar9;
  ulong uVar10;
  BignumInt BVar11;
  ulong local_a8;
  BignumDblInt ADC_temp;
  BignumDblInt MUL_temp;
  BignumInt bdata;
  BignumInt *bp;
  BignumInt *rq;
  BignumInt carry;
  BignumInt adata;
  BignumInt *rp;
  BignumInt *ap;
  BignumInt *rend;
  BignumInt *bend;
  BignumInt *aend;
  mp_int *b_local;
  mp_int *a_local;
  mp_int *r_local;
  
  pBVar1 = a->w;
  sVar2 = a->nw;
  pBVar3 = b->w;
  sVar4 = b->nw;
  pBVar8 = r->w + r->nw;
  adata = (BignumInt)r->w;
  for (rp = a->w; rp < pBVar1 + sVar2 && adata < pBVar8; rp = rp + 1) {
    uVar5 = *rp;
    rq = (BignumInt *)0x0;
    bp = (BignumInt *)adata;
    for (bdata = (BignumInt)b->w; bdata < pBVar3 + sVar4 && bp < pBVar8; bdata = bdata + 8) {
      if (bdata < pBVar3 + sVar4) {
        local_a8 = *(ulong *)bdata;
      }
      else {
        local_a8 = 0;
      }
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar5;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_a8;
      uVar9 = SUB168(auVar6 * auVar7,0);
      uVar10 = uVar9 + *bp;
      BVar11 = uVar10 + (long)rq;
      rq = (BignumInt *)
           (SUB168(auVar6 * auVar7,8) + (ulong)CARRY8(uVar9,*bp) + (ulong)CARRY8(uVar10,(ulong)rq));
      *bp = BVar11;
      bp = bp + 1;
    }
    for (; bp < pBVar8; bp = bp + 1) {
      BVar11 = (long)rq + *bp;
      rq = (BignumInt *)(ulong)CARRY8((ulong)rq,*bp);
      *bp = BVar11;
    }
    adata = adata + 8;
  }
  return;
}

Assistant:

static void mp_mul_add_simple(mp_int *r, mp_int *a, mp_int *b)
{
    BignumInt *aend = a->w + a->nw, *bend = b->w + b->nw, *rend = r->w + r->nw;

    for (BignumInt *ap = a->w, *rp = r->w;
         ap < aend && rp < rend; ap++, rp++) {

        BignumInt adata = *ap, carry = 0, *rq = rp;

        for (BignumInt *bp = b->w; bp < bend && rq < rend; bp++, rq++) {
            BignumInt bdata = bp < bend ? *bp : 0;
            BignumMULADD2(carry, *rq, adata, bdata, *rq, carry);
        }

        for (; rq < rend; rq++)
            BignumADC(*rq, carry, carry, *rq, 0);
    }
}